

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t sysbvm_type_createAnonymousMetatype(sysbvm_context_t *context)

{
  sysbvm_object_tuple_t *psVar1;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).metatypeType,0x1e);
  psVar1[4].field_1.pointers[0] = 0x1b;
  psVar1[3].field_1.pointers[0] = 0x1db;
  psVar1[4].header.field_0.typePointer = 0xb;
  psVar1[4].header.identityHashAndFlags = 0xb;
  psVar1[4].header.objectSize = 0;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousMetatype(sysbvm_context_t *context)
{
    sysbvm_metatype_t* result = (sysbvm_metatype_t*)sysbvm_context_allocatePointerTuple(context, context->roots.metatypeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_metatype_t));
    result->super.flags = sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_METATYPE_REQUIRED_FLAGS);

    size_t slotCount = SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_type_tuple_t);
    
    result->super.totalSlotCount = sysbvm_tuple_size_encode(context, slotCount);
    result->super.instanceSize = sysbvm_tuple_size_encode(context, 0);
    result->super.instanceAlignment = sysbvm_tuple_size_encode(context, 0);
    return (sysbvm_tuple_t)result;
}